

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O3

void trim(string *s)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  ulong uVar7;
  pointer pcVar8;
  char *pcVar9;
  char *pcVar10;
  pointer pcVar11;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar7 = s->_M_string_length;
  pcVar1 = pcVar2 + uVar7;
  pcVar9 = pcVar2;
  if (0 < (long)uVar7 >> 2) {
    pcVar9 = pcVar2 + (uVar7 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar7 >> 2) + 1;
    pcVar10 = pcVar2 + 3;
    do {
      iVar4 = isspace((int)pcVar10[-3]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0013eb84;
      }
      iVar4 = isspace((int)pcVar10[-2]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0013eb84;
      }
      iVar4 = isspace((int)pcVar10[-1]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0013eb84;
      }
      iVar4 = isspace((int)*pcVar10);
      if (iVar4 == 0) goto LAB_0013eb84;
      lVar6 = lVar6 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar1 - (long)pcVar9;
  if (lVar6 == 1) {
LAB_0013eb60:
    iVar4 = isspace((int)*pcVar9);
    pcVar10 = pcVar9;
    if (iVar4 != 0) {
      pcVar10 = pcVar1;
    }
LAB_0013eb84:
    if (pcVar1 == pcVar10) goto LAB_0013eb9b;
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  else {
    if (lVar6 == 2) {
LAB_0013eb4f:
      iVar4 = isspace((int)*pcVar9);
      pcVar10 = pcVar9;
      if (iVar4 != 0) {
        pcVar9 = pcVar9 + 1;
        goto LAB_0013eb60;
      }
      goto LAB_0013eb84;
    }
    if (lVar6 == 3) {
      iVar4 = isspace((int)*pcVar9);
      pcVar10 = pcVar9;
      if (iVar4 != 0) {
        pcVar9 = pcVar9 + 1;
        goto LAB_0013eb4f;
      }
      goto LAB_0013eb84;
    }
LAB_0013eb9b:
    s->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  uVar7 = s->_M_string_length;
  pcVar11 = pcVar3 + uVar7;
  lVar6 = (long)uVar7 >> 2;
  pcVar5 = pcVar11;
  if (0 < lVar6) {
    pcVar5 = pcVar11 + -(uVar7 & 0xfffffffffffffffc);
    pcVar11 = pcVar11 + lVar6 * -4;
    lVar6 = lVar6 + 1;
    do {
      iVar4 = isspace((int)pcVar3[uVar7 - 1]);
      if (iVar4 == 0) {
        pcVar8 = pcVar3 + uVar7;
        goto LAB_0013ecc8;
      }
      iVar4 = isspace((int)pcVar3[uVar7 - 2]);
      if (iVar4 == 0) {
        pcVar8 = pcVar3 + (uVar7 - 1);
        goto LAB_0013ecc8;
      }
      iVar4 = isspace((int)pcVar3[uVar7 - 3]);
      if (iVar4 == 0) {
        pcVar8 = pcVar3 + (uVar7 - 2);
        goto LAB_0013ecc8;
      }
      iVar4 = isspace((int)pcVar3[uVar7 - 4]);
      if (iVar4 == 0) {
        pcVar8 = pcVar3 + (uVar7 - 3);
        goto LAB_0013ecc8;
      }
      uVar7 = uVar7 - 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar5 - (long)pcVar3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pcVar8 = pcVar3;
      if ((lVar6 != 3) || (iVar4 = isspace((int)pcVar5[-1]), pcVar8 = pcVar5, iVar4 == 0))
      goto LAB_0013ecc8;
      pcVar5 = pcVar11 + -1;
      pcVar11 = pcVar5;
    }
    iVar4 = isspace((int)pcVar5[-1]);
    pcVar8 = pcVar5;
    if (iVar4 == 0) goto LAB_0013ecc8;
    pcVar5 = pcVar11 + -1;
  }
  iVar4 = isspace((int)pcVar5[-1]);
  pcVar8 = pcVar5;
  if (iVar4 != 0) {
    pcVar8 = pcVar3;
  }
LAB_0013ecc8:
  s->_M_string_length = (long)pcVar8 - (long)pcVar3;
  *pcVar8 = '\0';
  return;
}

Assistant:

static inline void trim(std::string* s)
{
    trim(*s);
}